

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner_tests.cpp
# Opt level: O0

MatrixXd *
createDownmixMatrixFromIndices
          (MatrixXd *__return_storage_ptr__,vector<int,_std::allocator<int>_> *indices,size_t size)

{
  bool bVar1;
  reference piVar2;
  Scalar *pSVar3;
  Index IVar4;
  RowXpr local_d0;
  ConstantReturnType local_88;
  undefined1 local_70 [8];
  VectorXd downmixRow;
  iterator iStack_58;
  int index;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  undefined1 local_21;
  size_t local_20;
  size_t size_local;
  vector<int,_std::allocator<int>_> *indices_local;
  MatrixXd *downmix;
  
  local_21 = 0;
  local_20 = size;
  size_local = (size_t)indices;
  indices_local = (vector<int,_std::allocator<int>_> *)__return_storage_ptr__;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((IdentityReturnType *)&__range1,size,size);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&__range1);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(indices);
  iStack_58 = std::vector<int,_std::allocator<int>_>::end(indices);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa8), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    downmixRow.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
         = *piVar2;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_88,local_20);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_70,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_88);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_70,
                        (long)downmixRow.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_);
    *pSVar3 = 1.0;
    IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&__return_storage_ptr__->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,IVar4 + 1,NoChange)
    ;
    IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&__return_storage_ptr__->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_d0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               IVar4 + -1);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_d0,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_70);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_70);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd createDownmixMatrixFromIndices(std::vector<int> indices,
                                               size_t size) {
  Eigen::MatrixXd downmix = Eigen::MatrixXd::Identity(size, size);
  for (int index : indices) {
    Eigen::VectorXd downmixRow = Eigen::VectorXd::Zero(size);
    downmixRow(index) = 1.0;
    downmix.conservativeResize(downmix.rows() + 1, Eigen::NoChange);
    downmix.row(downmix.rows() - 1) = downmixRow;
  }
  return downmix;
}